

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O0

bool crnlib::texture_conversion::dxt_progress_callback_func
               (uint percentage_complete,void *pUser_data_ptr)

{
  int iVar1;
  ulong uVar2;
  long *in_RSI;
  int in_EDI;
  int scaled_percentage_complete;
  progress_params *params;
  bool local_1;
  
  if ((*(byte *)((long)in_RSI + 0xc) & 1) == 0) {
    if (*(long *)(*in_RSI + 0x3f8) == 0) {
      local_1 = true;
    }
    else {
      iVar1 = math::clamp<int>((int)in_RSI[1] + (uint)(in_EDI * (100 - (int)in_RSI[1])) / 100,0,100)
      ;
      uVar2 = (**(code **)(*in_RSI + 0x3f8))(iVar1,*(undefined8 *)(*in_RSI + 0x400));
      if ((uVar2 & 1) == 0) {
        *(undefined1 *)((long)in_RSI + 0xc) = 1;
        local_1 = false;
      }
      else {
        local_1 = true;
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool dxt_progress_callback_func(uint percentage_complete, void* pUser_data_ptr) {
  progress_params& params = *static_cast<progress_params*>(pUser_data_ptr);

  if (params.m_canceled)
    return false;

  if (!params.m_pParams->m_pProgress_func)
    return true;

  int scaled_percentage_complete = params.m_start_percentage + (percentage_complete * (100 - params.m_start_percentage)) / 100;

  scaled_percentage_complete = math::clamp<int>(scaled_percentage_complete, 0, 100);

  if (!params.m_pParams->m_pProgress_func(scaled_percentage_complete, params.m_pParams->m_pProgress_user_data)) {
    params.m_canceled = true;
    return false;
  }

  return true;
}